

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void __thiscall
xmrig::Workers<xmrig::CpuLaunchData>::start
          (Workers<xmrig::CpuLaunchData> *this,
          vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *data)

{
  bool bVar1;
  __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
  *__lhs;
  Thread<xmrig::CpuLaunchData> *in_RDI;
  Thread<xmrig::CpuLaunchData> *worker;
  iterator __end0_1;
  iterator __begin0_1;
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  *__range1_1;
  CpuLaunchData *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *__range1;
  CpuLaunchData *in_stack_ffffffffffffff58;
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  *in_stack_ffffffffffffff60;
  IBackend *in_stack_ffffffffffffff68;
  __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
  *callback;
  Thread<xmrig::CpuLaunchData> *in_stack_ffffffffffffff70;
  Hashrate *in_stack_ffffffffffffff78;
  Hashrate *in_stack_ffffffffffffff80;
  __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
  local_58 [4];
  Hashrate *local_38;
  reference local_30;
  CpuLaunchData *local_28;
  __normal_iterator<const_xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (CpuLaunchData *)
       std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::begin
                 (in_stack_ffffffffffffff58);
  local_28 = (CpuLaunchData *)
             std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::end
                       ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                        in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
               ::operator*(local_20);
    in_stack_ffffffffffffff70 = in_RDI;
    in_stack_ffffffffffffff78 = (Hashrate *)operator_new(0x48);
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff78;
    std::
    vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
    ::size((vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
            *)in_RDI);
    Thread<xmrig::CpuLaunchData>::Thread
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60
               ,in_stack_ffffffffffffff58);
    local_38 = in_stack_ffffffffffffff78;
    std::
    vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
    ::push_back(in_stack_ffffffffffffff60,(value_type *)in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<const_xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
    ::operator++(local_20);
  }
  __lhs = (__normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
           *)operator_new(0x20);
  callback = __lhs;
  std::
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  ::size((vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
          *)in_RDI);
  Hashrate::Hashrate(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  *(__normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
    **)(in_RDI->m_config).affinity = __lhs;
  CpuLaunchData::backend();
  Nonce::touch(CPU);
  local_58[0]._M_current =
       (Thread<xmrig::CpuLaunchData> **)
       std::
       vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
       ::begin((vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                *)in_stack_ffffffffffffff58);
  std::
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  ::end((vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
         *)in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
                              *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
    ::operator*(local_58);
    Thread<xmrig::CpuLaunchData>::start(in_stack_ffffffffffffff70,(_func_void_void_ptr *)callback);
    __gnu_cxx::
    __normal_iterator<xmrig::Thread<xmrig::CpuLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>_>
    ::operator++(local_58);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}